

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDirectDemo_ls.c
# Opt level: O0

int Jac1(sunrealtype tn,N_Vector y,N_Vector fy,SUNMatrix J,void *user_data,N_Vector tmp1,
        N_Vector tmp2,N_Vector tmp3)

{
  double dVar1;
  double dVar2;
  sunrealtype y1;
  sunrealtype y0;
  N_Vector tmp2_local;
  N_Vector tmp1_local;
  void *user_data_local;
  SUNMatrix J_local;
  N_Vector fy_local;
  N_Vector y_local;
  sunrealtype tn_local;
  
  dVar1 = **(double **)((long)y->content + 0x10);
  dVar2 = *(double *)(*(long *)((long)y->content + 0x10) + 8);
  **(undefined8 **)(*(long *)((long)J->content + 0x20) + 8) = 0x3ff0000000000000;
  *(double *)(**(long **)((long)J->content + 0x20) + 8) = dVar1 * -6.0 * dVar2 + -1.0;
  *(double *)(*(long *)(*(long *)((long)J->content + 0x20) + 8) + 8) = (-dVar1 * dVar1 + 1.0) * 3.0;
  return 0;
}

Assistant:

static int Jac1(sunrealtype tn, N_Vector y, N_Vector fy, SUNMatrix J,
                void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  sunrealtype y0, y1;

  y0 = NV_Ith_S(y, 0);
  y1 = NV_Ith_S(y, 1);

  SM_ELEMENT_D(J, 0, 1) = ONE;
  SM_ELEMENT_D(J, 1, 0) = -TWO * P1_ETA * y0 * y1 - ONE;
  SM_ELEMENT_D(J, 1, 1) = P1_ETA * (ONE - SQR(y0));

  return (0);
}